

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void SobelXYRow_C(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint uVar6;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = src_sobelx[uVar3];
    bVar2 = src_sobely[uVar3];
    dst_argb[uVar3 * 4] = bVar2;
    uVar6 = (uint)bVar2 + (uint)bVar1;
    uVar5 = (uint8_t)uVar6;
    if (0xfe < uVar6) {
      uVar5 = 0xff;
    }
    dst_argb[uVar3 * 4 + 1] = uVar5;
    dst_argb[uVar3 * 4 + 2] = bVar1;
    dst_argb[uVar3 * 4 + 3] = 0xff;
  }
  return;
}

Assistant:

void SobelXYRow_C(const uint8_t* src_sobelx,
                  const uint8_t* src_sobely,
                  uint8_t* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int g = clamp255(r + b);
    dst_argb[0] = (uint8_t)(b);
    dst_argb[1] = (uint8_t)(g);
    dst_argb[2] = (uint8_t)(r);
    dst_argb[3] = (uint8_t)(255u);
    dst_argb += 4;
  }
}